

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBase.cpp
# Opt level: O1

void __thiscall
vkt::sparse::SparseResourcesBaseInstance::createDeviceSupportingQueues
          (SparseResourcesBaseInstance *this,QueueRequirementsVec *queueRequirements)

{
  Move<vk::VkDevice_s_*> *pMVar1;
  iterator __position;
  iterator __position_00;
  VkDevice pVVar2;
  SimpleAllocator *pSVar3;
  InstanceInterface *pIVar4;
  VkPhysicalDevice pVVar5;
  pointer pQVar6;
  mapped_type *pmVar7;
  vector<vkt::sparse::Queue,std::allocator<vkt::sparse::Queue>> *this_00;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  DeviceDriver *pDVar10;
  SimpleAllocator *this_01;
  VkQueue pVVar11;
  _Rb_tree_node_base *p_Var12;
  NotSupportedError *this_02;
  ResourceError *pRVar13;
  deUint32 queueNdx;
  ulong uVar14;
  ulong uVar15;
  MovePtr<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *this_03;
  uint uVar16;
  uint uVar17;
  deUint32 dVar18;
  deUint32 dVar19;
  deUint32 queueFamilyPropertiesCount;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> queueInfos;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  SelectedQueuesMap selectedQueueFamilies;
  QueuePrioritiesMap queuePriorities;
  Queue queue;
  VkPhysicalDeviceFeatures deviceFeatures;
  VkDeviceCreateInfo deviceInfo;
  uint local_45c;
  Move<vk::VkDevice_s_*> local_458;
  VkDeviceQueueCreateInfo *local_438;
  iterator iStack_430;
  VkDeviceQueueCreateInfo *local_428;
  uint local_414;
  VkPhysicalDevice local_410;
  InstanceInterface *local_408;
  QueueRequirementsVec *local_400;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_3f8;
  ulong local_3d8;
  map<unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>_>
  *local_3d0;
  map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
  local_3c8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_398;
  VkPhysicalDeviceMemoryProperties local_368;
  VkPhysicalDeviceFeatures local_154;
  VkDeviceCreateInfo local_78;
  
  local_400 = queueRequirements;
  pIVar4 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  local_45c = 0;
  (*pIVar4->_vptr_InstanceInterface[6])(pIVar4,pVVar5,&local_45c,0);
  if ((ulong)local_45c == 0) {
    pRVar13 = (ResourceError *)__cxa_allocate_exception(0x38);
    tcu::ResourceError::ResourceError
              (pRVar13,"Device reports an empty set of queue family properties",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
               ,0x4c);
    __cxa_throw(pRVar13,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  local_3f8.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::resize
            (&local_3f8,(ulong)local_45c);
  (*pIVar4->_vptr_InstanceInterface[6])
            (pIVar4,pVVar5,&local_45c,
             local_3f8.
             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_410 = pVVar5;
  local_408 = pIVar4;
  if (local_45c == 0) {
    pRVar13 = (ResourceError *)__cxa_allocate_exception(0x38);
    tcu::ResourceError::ResourceError
              (pRVar13,"Device reports an empty set of queue family properties",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
               ,0x54);
    __cxa_throw(pRVar13,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar15 = 0;
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398._M_impl.super__Rb_tree_header._M_header;
  local_398._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398._M_impl.super__Rb_tree_header._M_node_count = 0;
  pQVar6 = (local_400->
           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((local_400->
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      )._M_impl.super__Vector_impl_data._M_finish != pQVar6) {
    local_3d0 = &this->m_queues;
    do {
      pQVar6 = pQVar6 + uVar15;
      uVar14 = 0;
      uVar17 = 0;
      local_3d8 = uVar15;
      do {
        uVar15 = ((long)local_3f8.
                        super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_3f8.
                        super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        uVar16 = 0xffffffff;
        if (uVar14 <= uVar15 && uVar15 - uVar14 != 0) {
          do {
            uVar16 = (uint)uVar14;
            if ((pQVar6->queueFlags &
                ~local_3f8.
                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].queueFlags) == 0) break;
            uVar14 = (ulong)((uint)uVar14 + 1);
            uVar16 = 0xffffffff;
          } while (uVar14 <= uVar15 && uVar15 - uVar14 != 0);
        }
        local_154.robustBufferAccess = uVar16;
        if (uVar16 == 0xffffffff) {
          this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_02,"No match found for queue requirements",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
                     ,0x65);
          __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        dVar19 = pQVar6->queueCount - uVar17;
        if ((int)local_3f8.
                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16].queueCount < (int)dVar19) {
          dVar19 = local_3f8.
                   super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].queueCount;
        }
        local_414 = uVar17;
        pmVar7 = std::
                 map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                 ::operator[](&local_3c8,&local_154.robustBufferAccess);
        dVar18 = pmVar7->queueCount;
        pmVar7 = std::
                 map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                 ::operator[](&local_3c8,&local_154.robustBufferAccess);
        if ((int)dVar18 < (int)dVar19) {
          dVar18 = dVar19;
        }
        pmVar7->queueCount = dVar18;
        if (dVar19 != 0) {
          dVar18 = 0;
          do {
            local_368.memoryTypes[1].propertyFlags = dVar18;
            local_368.memoryTypes[0].heapIndex = uVar16;
            this_00 = (vector<vkt::sparse::Queue,std::allocator<vkt::sparse::Queue>> *)
                      std::
                      map<unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>_>
                      ::operator[](local_3d0,&pQVar6->queueFlags);
            __position._M_current = *(Queue **)(this_00 + 8);
            if (__position._M_current == *(Queue **)(this_00 + 0x10)) {
              std::vector<vkt::sparse::Queue,std::allocator<vkt::sparse::Queue>>::
              _M_realloc_insert<vkt::sparse::Queue_const&>(this_00,__position,(Queue *)&local_368);
            }
            else {
              (__position._M_current)->queueHandle = (VkQueue)local_368._0_8_;
              (__position._M_current)->queueFamilyIndex = local_368.memoryTypes[0].heapIndex;
              (__position._M_current)->queueIndex = local_368.memoryTypes[1].propertyFlags;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
            }
            dVar18 = dVar18 + 1;
          } while (dVar19 != dVar18);
        }
        uVar17 = local_414 + dVar19;
        local_154.robustBufferAccess = uVar16 + 1;
        uVar14 = (ulong)local_154.robustBufferAccess;
      } while (uVar17 < pQVar6->queueCount);
      uVar15 = (ulong)((int)local_3d8 + 1);
      pQVar6 = (local_400->
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(local_400->
                                    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pQVar6 >> 3)
            );
  }
  local_438 = (VkDeviceQueueCreateInfo *)0x0;
  iStack_430._M_current = (VkDeviceQueueCreateInfo *)0x0;
  local_428 = (VkDeviceQueueCreateInfo *)0x0;
  if ((_Rb_tree_header *)local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_3c8._M_t._M_impl.super__Rb_tree_header) {
    p_Var9 = local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (*(int *)&p_Var9[1].field_0x4 != 0) {
        uVar17 = 0;
        do {
          pmVar8 = std::
                   map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                 *)&local_398,&p_Var9[1]._M_color);
          local_368.memoryTypeCount = 0x3f800000;
          __position_00._M_current =
               (pmVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (pmVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (pmVar8,__position_00,(float *)&local_368);
          }
          else {
            *__position_00._M_current = 1.0;
            (pmVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < *(uint *)&p_Var9[1].field_0x4);
      }
      local_368.memoryTypeCount = 2;
      local_368.memoryTypes._4_8_ = (void *)0x0;
      local_368.memoryTypes._12_8_ = (ulong)p_Var9[1]._M_color << 0x20;
      local_368.memoryTypes[2].heapIndex = *(deUint32 *)&p_Var9[1].field_0x4;
      pmVar8 = std::
               map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[]((map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                             *)&local_398,&p_Var9[1]._M_color);
      local_368.memoryTypes._28_8_ =
           (pmVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
      if (iStack_430._M_current == local_428) {
        std::vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>::
        _M_realloc_insert<vk::VkDeviceQueueCreateInfo_const&>
                  ((vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>
                    *)&local_438,iStack_430,(VkDeviceQueueCreateInfo *)&local_368);
      }
      else {
        (iStack_430._M_current)->pQueuePriorities = (float *)local_368.memoryTypes._28_8_;
        (iStack_430._M_current)->flags = local_368.memoryTypes[1].heapIndex;
        (iStack_430._M_current)->queueFamilyIndex = local_368.memoryTypes[2].propertyFlags;
        *(ulong *)&(iStack_430._M_current)->queueCount =
             CONCAT44(local_368.memoryTypes[3].propertyFlags,local_368.memoryTypes[2].heapIndex);
        (iStack_430._M_current)->sType = local_368.memoryTypeCount;
        *(VkMemoryPropertyFlags *)&(iStack_430._M_current)->field_0x4 =
             local_368.memoryTypes[0].propertyFlags;
        (iStack_430._M_current)->pNext = (void *)local_368.memoryTypes._4_8_;
        iStack_430._M_current = iStack_430._M_current + 1;
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != &local_3c8._M_t._M_impl.super__Rb_tree_header);
  }
  pIVar4 = local_408;
  pVVar5 = local_410;
  ::vk::getPhysicalDeviceFeatures(&local_154,local_408,local_410);
  local_78.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  local_78.pNext = (void *)0x0;
  local_78.flags = 0;
  local_78.queueCreateInfoCount =
       (int)((ulong)((long)iStack_430._M_current - (long)local_438) >> 3) * -0x33333333;
  local_78.pQueueCreateInfos = local_438;
  local_78.enabledLayerCount = 0;
  local_78.ppEnabledLayerNames = (char **)0x0;
  local_78.enabledExtensionCount = 0;
  local_78.ppEnabledExtensionNames = (char **)0x0;
  local_78.pEnabledFeatures = &local_154;
  ::vk::createDevice(&local_458,pIVar4,pVVar5,&local_78,(VkAllocationCallbacks *)0x0);
  local_368.memoryTypes._12_8_ =
       local_458.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  local_368._0_8_ = local_458.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_368.memoryTypes._4_8_ =
       local_458.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  local_458.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice)0x0;
  local_458.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_458.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pVVar2 = (this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  if (pVVar2 != (VkDevice)0x0) {
    (*(this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (pVVar2,(this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.
                      m_allocator);
  }
  pMVar1 = &this->m_logicalDevice;
  (this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)local_368.memoryTypes._12_8_;
  (pMVar1->super_RefBase<vk::VkDevice_s_*>).m_data.object = (VkDevice_s *)local_368._0_8_;
  (this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)local_368.memoryTypes._4_8_;
  if (local_458.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_458.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_458.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_458.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  pDVar10 = (DeviceDriver *)operator_new(0x4b8);
  ::vk::DeviceDriver::DeviceDriver
            (pDVar10,pIVar4,(pMVar1->super_RefBase<vk::VkDevice_s_*>).m_data.object);
  local_368.memoryTypeCount = 0;
  local_368.memoryTypes[0].propertyFlags = 0;
  this_03 = &this->m_deviceDriver;
  if ((this->m_deviceDriver).
      super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr !=
      pDVar10) {
    de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::reset
              (&this_03->super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>);
    (this_03->super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>).m_data.ptr
         = pDVar10;
  }
  de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::reset
            ((UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)&local_368);
  this_01 = (SimpleAllocator *)operator_new(0x220);
  pDVar10 = (this_03->super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>).
            m_data.ptr;
  pVVar2 = (pMVar1->super_RefBase<vk::VkDevice_s_*>).m_data.object;
  ::vk::getPhysicalDeviceMemoryProperties(&local_368,local_408,local_410);
  ::vk::SimpleAllocator::SimpleAllocator(this_01,&pDVar10->super_DeviceInterface,pVVar2,&local_368);
  pSVar3 = (SimpleAllocator *)
           (this->m_allocator).super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.
           m_data.ptr;
  if (pSVar3 != this_01) {
    if (pSVar3 != (SimpleAllocator *)0x0) {
      (*(pSVar3->super_Allocator)._vptr_Allocator[1])();
      (this->m_allocator).super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data
      .ptr = (Allocator *)0x0;
    }
    (this->m_allocator).super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.
    ptr = (Allocator *)this_01;
  }
  for (p_Var12 = (this->m_queues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != &(this->m_queues)._M_t._M_impl.super__Rb_tree_header;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    p_Var9 = p_Var12[1]._M_parent;
    if (p_Var12[1]._M_left != p_Var9) {
      uVar17 = 1;
      uVar15 = 0;
      do {
        pDVar10 = (DeviceDriver *)(pMVar1->super_RefBase<vk::VkDevice_s_*>).m_data.object;
        pVVar11 = ::vk::getDeviceQueue
                            (&((this_03->
                               super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>
                               ).m_data.ptr)->super_DeviceInterface,(VkDevice)pDVar10,
                             *(deUint32 *)(&p_Var9->_M_parent + uVar15 * 2),
                             *(deUint32 *)((long)&p_Var9->_M_parent + uVar15 * 0x10 + 4));
        *(VkQueue *)(&p_Var9->_M_color + uVar15 * 4) = pVVar11;
        uVar15 = (ulong)uVar17;
        p_Var9 = p_Var12[1]._M_parent;
        uVar17 = uVar17 + 1;
      } while (uVar15 < (ulong)((long)p_Var12[1]._M_left - (long)p_Var9 >> 4));
    }
  }
  if (local_438 != (VkDeviceQueueCreateInfo *)0x0) {
    pDVar10 = (DeviceDriver *)((long)local_428 - (long)local_438);
    operator_delete(local_438,(ulong)pDVar10);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~_Rb_tree(&local_398);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>,_std::_Select1st<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
  ::_M_erase((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>,_std::_Select1st<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
              *)local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)pDVar10
            );
  if (local_3f8.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.
                    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SparseResourcesBaseInstance::createDeviceSupportingQueues(const QueueRequirementsVec& queueRequirements)
{
	typedef std::map<vk::VkQueueFlags, std::vector<Queue> >		QueuesMap;
	typedef std::map<deUint32, QueueFamilyQueuesCount>			SelectedQueuesMap;
	typedef std::map<deUint32, std::vector<float> >				QueuePrioritiesMap;

	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	deUint32 queueFamilyPropertiesCount = 0u;
	instance.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &queueFamilyPropertiesCount, DE_NULL);

	if(queueFamilyPropertiesCount == 0u)
		TCU_THROW(ResourceError, "Device reports an empty set of queue family properties");

	std::vector<VkQueueFamilyProperties> queueFamilyProperties;
	queueFamilyProperties.resize(queueFamilyPropertiesCount);

	instance.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &queueFamilyPropertiesCount, &queueFamilyProperties[0]);

	if (queueFamilyPropertiesCount == 0u)
		TCU_THROW(ResourceError, "Device reports an empty set of queue family properties");

	SelectedQueuesMap	selectedQueueFamilies;
	QueuePrioritiesMap	queuePriorities;

	for (deUint32 queueReqNdx = 0; queueReqNdx < queueRequirements.size(); ++queueReqNdx)
	{
		const QueueRequirements& queueRequirement = queueRequirements[queueReqNdx];

		deUint32 queueFamilyIndex	= 0u;
		deUint32 queuesFoundCount	= 0u;

		do
		{
			queueFamilyIndex = findMatchingQueueFamilyIndex(queueFamilyProperties, queueRequirement.queueFlags, queueFamilyIndex);

			if (queueFamilyIndex == NO_MATCH_FOUND)
				TCU_THROW(NotSupportedError, "No match found for queue requirements");

			const deUint32 queuesPerFamilyCount = deMin32(queueFamilyProperties[queueFamilyIndex].queueCount, queueRequirement.queueCount - queuesFoundCount);

			selectedQueueFamilies[queueFamilyIndex].queueCount = deMax32(queuesPerFamilyCount, selectedQueueFamilies[queueFamilyIndex].queueCount);

			for (deUint32 queueNdx = 0; queueNdx < queuesPerFamilyCount; ++queueNdx)
			{
				Queue queue;
				queue.queueFamilyIndex	= queueFamilyIndex;
				queue.queueIndex		= queueNdx;

				m_queues[queueRequirement.queueFlags].push_back(queue);
			}

			queuesFoundCount += queuesPerFamilyCount;

			++queueFamilyIndex;
		} while (queuesFoundCount < queueRequirement.queueCount);
	}

	std::vector<VkDeviceQueueCreateInfo> queueInfos;

	for (SelectedQueuesMap::iterator queueFamilyIter = selectedQueueFamilies.begin(); queueFamilyIter != selectedQueueFamilies.end(); ++queueFamilyIter)
	{
		for (deUint32 queueNdx = 0; queueNdx < queueFamilyIter->second.queueCount; ++queueNdx)
			queuePriorities[queueFamilyIter->first].push_back(1.0f);

		const VkDeviceQueueCreateInfo queueInfo =
		{
			VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,		// VkStructureType             sType;
			DE_NULL,										// const void*                 pNext;
			(VkDeviceQueueCreateFlags)0u,					// VkDeviceQueueCreateFlags    flags;
			queueFamilyIter->first,							// uint32_t                    queueFamilyIndex;
			queueFamilyIter->second.queueCount,				// uint32_t                    queueCount;
			&queuePriorities[queueFamilyIter->first][0],	// const float*                pQueuePriorities;
		};

		queueInfos.push_back(queueInfo);
	}

	const VkPhysicalDeviceFeatures	deviceFeatures	= getPhysicalDeviceFeatures(instance, physicalDevice);
	const VkDeviceCreateInfo		deviceInfo		=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,		// VkStructureType                    sType;
		DE_NULL,									// const void*                        pNext;
		(VkDeviceCreateFlags)0,						// VkDeviceCreateFlags                flags;
		static_cast<deUint32>(queueInfos.size()),	// uint32_t                           queueCreateInfoCount;
		&queueInfos[0],								// const VkDeviceQueueCreateInfo*     pQueueCreateInfos;
		0u,											// uint32_t                           enabledLayerCount;
		DE_NULL,									// const char* const*                 ppEnabledLayerNames;
		0u,											// uint32_t                           enabledExtensionCount;
		DE_NULL,									// const char* const*                 ppEnabledExtensionNames;
		&deviceFeatures,							// const VkPhysicalDeviceFeatures*    pEnabledFeatures;
	};

	m_logicalDevice = createDevice(instance, physicalDevice, &deviceInfo);
	m_deviceDriver	= de::MovePtr<DeviceDriver>(new DeviceDriver(instance, *m_logicalDevice));
	m_allocator		= de::MovePtr<Allocator>(new SimpleAllocator(*m_deviceDriver, *m_logicalDevice, getPhysicalDeviceMemoryProperties(instance, physicalDevice)));

	for (QueuesMap::iterator queuesIter = m_queues.begin(); queuesIter != m_queues.end(); ++queuesIter)
	{
		for (deUint32 queueNdx = 0u; queueNdx < queuesIter->second.size(); ++queueNdx)
		{
			Queue& queue = queuesIter->second[queueNdx];

			queue.queueHandle = getDeviceQueue(*m_deviceDriver, *m_logicalDevice, queue.queueFamilyIndex, queue.queueIndex);
		}
	}
}